

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O3

void __thiscall fasttext::Args::Args(Args *this)

{
  (this->input)._M_dataplus._M_p = (pointer)&(this->input).field_2;
  (this->input)._M_string_length = 0;
  (this->input).field_2._M_local_buf[0] = '\0';
  (this->output)._M_dataplus._M_p = (pointer)&(this->output).field_2;
  (this->output)._M_string_length = 0;
  (this->output).field_2._M_local_buf[0] = '\0';
  (this->label)._M_dataplus._M_p = (pointer)&(this->label).field_2;
  (this->label)._M_string_length = 0;
  (this->label).field_2._M_local_buf[0] = '\0';
  (this->pretrainedVectors)._M_dataplus._M_p = (pointer)&(this->pretrainedVectors).field_2;
  (this->pretrainedVectors)._M_string_length = 0;
  (this->pretrainedVectors).field_2._M_local_buf[0] = '\0';
  this->lr = 0.05;
  this->loss = ns;
  this->model = sg;
  this->bucket = 2000000;
  this->minn = 3;
  this->maxn = 6;
  this->thread = 0xc;
  this->lrUpdateRate = 100;
  this->dim = 100;
  this->ws = 5;
  this->epoch = 5;
  this->minCount = 5;
  this->minCountLabel = 0;
  this->neg = 5;
  this->wordNgrams = 1;
  this->t = 0.0001;
  std::__cxx11::string::_M_replace((ulong)&this->label,0,(char *)0x0,0x125880);
  this->verbose = 2;
  std::__cxx11::string::_M_replace
            ((ulong)&this->pretrainedVectors,0,(char *)(this->pretrainedVectors)._M_string_length,
             0x125694);
  this->cutoff = 0;
  this->saveOutput = false;
  this->qout = false;
  this->retrain = false;
  this->qnorm = false;
  this->dsub = 2;
  return;
}

Assistant:

Args::Args() {
  lr = 0.05;
  dim = 100;
  ws = 5;
  epoch = 5;
  minCount = 5;
  minCountLabel = 0;
  neg = 5;
  wordNgrams = 1;
  loss = loss_name::ns;
  model = model_name::sg;
  bucket = 2000000;
  minn = 3;
  maxn = 6;
  thread = 12;
  lrUpdateRate = 100;
  t = 1e-4;
  label = "__label__";
  verbose = 2;
  pretrainedVectors = "";
  saveOutput = false;

  qout = false;
  retrain = false;
  qnorm = false;
  cutoff = 0;
  dsub = 2;
}